

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomialfit.cpp
# Opt level: O0

bool __thiscall PolynomialFit::process(PolynomialFit *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  fraction *in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 in_ST7;
  int i;
  AugmentedMatrix am;
  AugmentedMatrix *this_00;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  uint uVar3;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  AugmentedMatrix local_328;
  byte local_1;
  
  bVar1 = leastQuare((PolynomialFit *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
  ;
  if (bVar1) {
    this_00 = &local_328;
    AugmentedMatrix::AugmentedMatrix(this_00);
    AugmentedMatrix::setMatrixData
              ((AugmentedMatrix *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
    AugmentedMatrix::setAugmentData
              (&local_328,*(fraction **)((long)in_RDI + 0x48),*(int *)((long)in_RDI + 0x18));
    bVar1 = AugmentedMatrix::process((AugmentedMatrix *)0x1050bd);
    if (bVar1) {
      uVar2 = extraout_RDX;
      for (uVar3 = 0; (int)uVar3 < *(int *)((long)in_RDI + 0x18); uVar3 = uVar3 + 1) {
        AugmentedMatrix::getResult
                  ((fraction *)&local_328,(AugmentedMatrix *)(ulong)uVar3,(int)uVar2);
        *(unkbyte10 *)(*(long *)(in_RDI + 5) + (long)(int)uVar3 * 0x10) = in_ST0;
        uVar2 = extraout_RDX_00;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
    AugmentedMatrix::~AugmentedMatrix((AugmentedMatrix *)0x105163);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool PolynomialFit::process()
{
    // ������С���˷���һ�η�����
    if(!leastQuare())
        return false;

    // ͨ����˹���ⷽ����
    AugmentedMatrix am;
    am.setMatrixData( matrix , multiterm , multiterm ) ;
    am.setAugmentData( rvector , multiterm);
    if( !am.process() )
        return false;

    // �����Ľ������Ƕ���ʽ��ϵ��
    for(int i=0;i<multiterm;i++){
        results[i] = am.getResult(i);
    }

    return true;
}